

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O3

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::remove_shadowed_matches
          (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr__,
          LongReadsMapper *this,vector<LongReadMapping,_std::allocator<LongReadMapping>_> *matches)

{
  iterator __position;
  sgNodeID_t sVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  int32_t iVar6;
  const_iterator __begin2;
  pointer pLVar7;
  const_iterator __end2;
  pointer pLVar8;
  LongReadMapping *__args;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2;
  ulong uVar9;
  
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar7 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar8 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar8 != pLVar7) {
    uVar9 = 0;
    do {
      __args = pLVar7 + uVar9;
      if (pLVar7 != pLVar8) {
        do {
          if (((pLVar7->qStart <= __args->qStart) && (__args->qEnd <= pLVar7->qEnd)) &&
             (__args->score < pLVar7->score)) goto LAB_001a491a;
          pLVar7 = pLVar7 + 1;
        } while (pLVar7 != pLVar8);
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
        _M_realloc_insert<LongReadMapping_const&>
                  ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)__return_storage_ptr__
                   ,__position,__args);
      }
      else {
        sVar1 = __args->node;
        uVar5 = __args->read_id;
        iVar6 = __args->nStart;
        iVar2 = __args->qStart;
        iVar3 = __args->qEnd;
        iVar4 = __args->score;
        (__position._M_current)->nEnd = __args->nEnd;
        (__position._M_current)->qStart = iVar2;
        (__position._M_current)->qEnd = iVar3;
        (__position._M_current)->score = iVar4;
        (__position._M_current)->node = sVar1;
        (__position._M_current)->read_id = uVar5;
        (__position._M_current)->nStart = iVar6;
        (__return_storage_ptr__->
        super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_001a491a:
      uVar9 = uVar9 + 1;
      pLVar7 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pLVar8 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar9 < (ulong)((long)pLVar8 - (long)pLVar7 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LongReadMapping> LongReadsMapper::remove_shadowed_matches(const std::vector<LongReadMapping> &matches) const {
    std::vector<LongReadMapping> filtered_matches;

    for (auto mi1=0;mi1<matches.size();++mi1){
        auto &m1=matches[mi1];
        bool use=true;
        for (auto &m2: matches) {
            if (m2.qStart<=m1.qStart and m2.qEnd>=m1.qEnd and m2.score>m1.score){
                use=false;
                break;
            }
        }
        if (use) filtered_matches.emplace_back(m1);
    }

    return filtered_matches;
}